

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControllerWidget::mousePressEvent(ControllerWidget *this,QMouseEvent *event)

{
  long lVar1;
  MouseButton MVar2;
  SubControl SVar3;
  QSinglePointEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = QSinglePointEvent::button(in_RSI);
  if (MVar2 == LeftButton) {
    QVar4 = QSinglePointEvent::position((QSinglePointEvent *)0x62b6ce);
    QPointF::toPoint((QPointF *)QVar4.xp);
    SVar3 = getSubControl((ControllerWidget *)QVar4.yp,(QPoint *)QVar4.xp);
    *(SubControl *)(in_RDI + 1) = SVar3;
    QWidget::update(in_RDI);
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }
    activeControl = getSubControl(event->position().toPoint());
    update();
}